

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprDoWhile * AnalyzeDoWhile(ExpressionContext *ctx,SynDoWhile *syntax)

{
  TypeBase *type;
  IntrusiveList<ExprBase> expressions_00;
  ExprBase *pEVar1;
  ExprBase *condition_00;
  ExprBlock *this;
  SynBase *source;
  FunctionData *onwerFunction;
  ExprBase *closures;
  ExprDoWhile *this_00;
  ExprBase *block;
  ExprBase *condition;
  SynBase *expression;
  IntrusiveList<ExprBase> expressions;
  SynDoWhile *syntax_local;
  ExpressionContext *ctx_local;
  
  expressions.tail = (ExprBase *)syntax;
  ExpressionContext::PushLoopScope(ctx,true,true);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&expression);
  for (condition = (ExprBase *)expressions.tail[1].source; condition != (ExprBase *)0x0;
      condition = (ExprBase *)condition[1]._vptr_ExprBase) {
    pEVar1 = AnalyzeStatement(ctx,(SynBase *)condition);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&expression,pEVar1);
  }
  pEVar1 = AnalyzeExpression(ctx,(SynBase *)expressions.tail[1].next);
  condition_00 = CreateConditionCast(ctx,pEVar1->source,pEVar1);
  this = ExpressionContext::get<ExprBlock>(ctx);
  pEVar1 = expressions.tail;
  type = ctx->typeVoid;
  source = &ExpressionContext::MakeInternal(ctx,(SynBase *)expressions.tail)->super_SynBase;
  onwerFunction = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
  closures = CreateBlockUpvalueClose(ctx,source,onwerFunction,ctx->scope);
  expressions_00.tail = expressions.head;
  expressions_00.head = (ExprBase *)expression;
  ExprBlock::ExprBlock(this,(SynBase *)pEVar1,type,expressions_00,closures);
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  this_00 = ExpressionContext::get<ExprDoWhile>(ctx);
  ExprDoWhile::ExprDoWhile
            (this_00,(SynBase *)expressions.tail,ctx->typeVoid,&this->super_ExprBase,condition_00);
  return this_00;
}

Assistant:

ExprDoWhile* AnalyzeDoWhile(ExpressionContext &ctx, SynDoWhile *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ExprBase *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprDoWhile>()) ExprDoWhile(syntax, ctx.typeVoid, block, condition);
}